

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O2

Image * Image_Function_Helper::ConvertToRgb
                  (Image *__return_storage_ptr__,ConvertToRgbForm4 convertToRgb,Image *in)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (__return_storage_ptr__,in,in->_width,in->_height,'\x03','\x01');
  (*convertToRgb)(in,0,0,__return_storage_ptr__,0,0,__return_storage_ptr__->_width,
                  __return_storage_ptr__->_height);
  return __return_storage_ptr__;
}

Assistant:

Image ConvertToRgb( FunctionTable::ConvertToRgbForm4 convertToRgb,
                        const Image & in )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height(), RGB );

        convertToRgb( in, 0, 0, out, 0, 0, out.width(), out.height() );

        return out;
    }